

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O1

bool __thiscall cmCPackDebGenerator::createDeb(cmCPackDebGenerator *this)

{
  size_type *psVar1;
  pointer pcVar2;
  cmCPackLog *logger;
  bool bVar3;
  bool bVar4;
  bool genPostRm;
  bool permissionStrictPolicy;
  string *psVar5;
  mapped_type *pmVar6;
  cmValue cVar7;
  cmValue numThreads;
  cmValue controlExtra;
  string strGenWDIR;
  string shlibsfilename;
  string postinst;
  string postrm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  controlValues;
  DebGenerator gen;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  cmValue local_88;
  cmValue local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &controlValues._M_t._M_impl.super__Rb_tree_header._M_header;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  strGenWDIR._M_dataplus._M_p = (pointer)&strGenWDIR.field_2;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&strGenWDIR,"GEN_CPACK_DEBIAN_PACKAGE_NAME","");
  psVar5 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&strGenWDIR);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  cmsys::SystemTools::LowerCase((string *)&gen,psVar5);
  shlibsfilename._M_dataplus._M_p = (pointer)&shlibsfilename.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&shlibsfilename,"Package","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&shlibsfilename);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&gen);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shlibsfilename._M_dataplus._M_p != &shlibsfilename.field_2) {
    operator_delete(shlibsfilename._M_dataplus._M_p,shlibsfilename.field_2._M_allocated_capacity + 1
                   );
  }
  psVar1 = &gen.OutputName._M_string_length;
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_VERSION","");
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  strGenWDIR._M_dataplus._M_p = (pointer)&strGenWDIR.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&strGenWDIR,"Version","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SECTION","");
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  strGenWDIR._M_dataplus._M_p = (pointer)&strGenWDIR.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&strGenWDIR,"Section","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_PRIORITY","");
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  strGenWDIR._M_dataplus._M_p = (pointer)&strGenWDIR.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&strGenWDIR,"Priority","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE","");
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  strGenWDIR._M_dataplus._M_p = (pointer)&strGenWDIR.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&strGenWDIR,"Architecture","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER","");
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  strGenWDIR._M_dataplus._M_p = (pointer)&strGenWDIR.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&strGenWDIR,"Maintainer","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION","");
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  strGenWDIR._M_dataplus._M_p = (pointer)&strGenWDIR.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&strGenWDIR,"Description","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SOURCE","");
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Source","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_DEPENDS","");
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Depends","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS","");
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Recommends","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS","");
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Suggests","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE","");
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Homepage","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS","");
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Pre-Depends","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_ENHANCES","");
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Enhances","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_BREAKS","");
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Breaks","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS","");
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Conflicts","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_PROVIDES","");
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Provides","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_REPLACES","");
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    gen.Logger = (cmCPackLog *)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"Replaces","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if (gen.Logger != (cmCPackLog *)psVar1) {
      operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
    }
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gen,"GEN_WDIR","");
  psVar5 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  strGenWDIR._M_dataplus._M_p = (pointer)&strGenWDIR.field_2;
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&strGenWDIR,pcVar2,pcVar2 + psVar5->_M_string_length);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  shlibsfilename._M_dataplus._M_p = (pointer)&shlibsfilename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&shlibsfilename,strGenWDIR._M_dataplus._M_p,
             strGenWDIR._M_dataplus._M_p + strGenWDIR._M_string_length);
  std::__cxx11::string::append((char *)&shlibsfilename);
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SHLIBS","");
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"CPACK_DEBIAN_PACKAGE_GENERATE_SHLIBS","");
  bVar3 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)&gen);
  if (bVar3 && cVar7.Value != (string *)0x0) {
    bVar3 = (cVar7.Value)->_M_string_length != 0;
  }
  else {
    bVar3 = false;
  }
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if (bVar3 != false) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&gen,None);
    cmGeneratedFileStream::Open((cmGeneratedFileStream *)&gen,&shlibsfilename,false,true);
    operator<<((ostream *)&gen,cVar7);
    postinst._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&gen,(char *)&postinst,1);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&gen);
  }
  postinst._M_dataplus._M_p = (pointer)&postinst.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&postinst,strGenWDIR._M_dataplus._M_p,
             strGenWDIR._M_dataplus._M_p + strGenWDIR._M_string_length);
  std::__cxx11::string::append((char *)&postinst);
  postrm._M_dataplus._M_p = (pointer)&postrm.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&postrm,strGenWDIR._M_dataplus._M_p,
             strGenWDIR._M_dataplus._M_p + strGenWDIR._M_string_length);
  std::__cxx11::string::append((char *)&postrm);
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_GENERATE_POSTINST","");
  bVar4 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if (bVar4) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&gen,None);
    cmGeneratedFileStream::Open((cmGeneratedFileStream *)&gen,&postinst,false,true);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&gen,
               "#!/bin/sh\n\nset -e\n\nif [ \"$1\" = \"configure\" ]; then\n\tldconfig\nfi\n",0x40);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&gen);
  }
  gen.Logger = (cmCPackLog *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gen,"GEN_CPACK_DEBIAN_GENERATE_POSTRM","");
  bVar4 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)&gen);
  if (gen.Logger != (cmCPackLog *)psVar1) {
    operator_delete(gen.Logger,gen.OutputName._M_string_length + 1);
  }
  if (bVar4) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&gen,None);
    cmGeneratedFileStream::Open((cmGeneratedFileStream *)&gen,&postrm,false,true);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&gen,
               "#!/bin/sh\n\nset -e\n\nif [ \"$1\" = \"remove\" ]; then\n\tldconfig\nfi\n",0x3d);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&gen);
  }
  logger = (this->super_cmCPackGenerator).Logger;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"GEN_CPACK_OUTPUT_FILE_NAME","");
  psVar5 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_c8);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + psVar5->_M_string_length);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,strGenWDIR._M_dataplus._M_p,
             strGenWDIR._M_dataplus._M_p + strGenWDIR._M_string_length);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,"CPACK_TOPLEVEL_DIRECTORY","");
  psVar5 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_128);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar2,pcVar2 + psVar5->_M_string_length);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_168,"CPACK_TEMPORARY_DIRECTORY","");
  psVar5 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_168);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,pcVar2,pcVar2 + psVar5->_M_string_length);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,"GEN_CPACK_DEBIAN_COMPRESSION_TYPE","");
  cVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_188);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"CPACK_THREADS","");
  numThreads = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1a8);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,"GEN_CPACK_DEBIAN_ARCHIVE_TYPE","");
  local_80 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_60,&controlValues._M_t);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,shlibsfilename._M_dataplus._M_p,
             shlibsfilename._M_dataplus._M_p + shlibsfilename._M_string_length);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,"GEN_CPACK_DEBIAN_GENERATE_POSTINST","");
  bVar4 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_208);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,postinst._M_dataplus._M_p,
             postinst._M_dataplus._M_p + postinst._M_string_length);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"GEN_CPACK_DEBIAN_GENERATE_POSTRM","");
  genPostRm = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_248);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,postrm._M_dataplus._M_p,
             postrm._M_dataplus._M_p + postrm._M_string_length);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA","");
  controlExtra = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_288);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_88 = cVar7;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION","");
  permissionStrictPolicy = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_2a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,&this->packageFiles);
  anon_unknown.dwarf_2798c1::DebGenerator::DebGenerator
            (&gen,logger,&local_a8,&local_e8,&local_108,&local_148,local_88,numThreads,local_80,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_60,bVar3,&local_1e8,bVar4,&local_228,genPostRm,&local_268,controlExtra,
             permissionStrictPolicy,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  bVar3 = anon_unknown.dwarf_2798c1::DebGenerator::generate(&gen);
  anon_unknown.dwarf_2798c1::DebGenerator::~DebGenerator(&gen);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postrm._M_dataplus._M_p != &postrm.field_2) {
    operator_delete(postrm._M_dataplus._M_p,postrm.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postinst._M_dataplus._M_p != &postinst.field_2) {
    operator_delete(postinst._M_dataplus._M_p,postinst.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shlibsfilename._M_dataplus._M_p != &shlibsfilename.field_2) {
    operator_delete(shlibsfilename._M_dataplus._M_p,shlibsfilename.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&controlValues._M_t);
  return bVar3;
}

Assistant:

bool cmCPackDebGenerator::createDeb()
{
  std::map<std::string, std::string> controlValues;

  // debian policy enforce lower case for package name
  controlValues["Package"] = cmsys::SystemTools::LowerCase(
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME"));
  controlValues["Version"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_VERSION");
  controlValues["Section"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SECTION");
  controlValues["Priority"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PRIORITY");
  controlValues["Architecture"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE");
  controlValues["Maintainer"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER");
  controlValues["Description"] =
    *this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION");

  cmValue debian_pkg_source =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SOURCE");
  if (cmNonempty(debian_pkg_source)) {
    controlValues["Source"] = *debian_pkg_source;
  }
  cmValue debian_pkg_dep = this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DEPENDS");
  if (cmNonempty(debian_pkg_dep)) {
    controlValues["Depends"] = *debian_pkg_dep;
  }
  cmValue debian_pkg_rec =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS");
  if (cmNonempty(debian_pkg_rec)) {
    controlValues["Recommends"] = *debian_pkg_rec;
  }
  cmValue debian_pkg_sug =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS");
  if (cmNonempty(debian_pkg_sug)) {
    controlValues["Suggests"] = *debian_pkg_sug;
  }
  cmValue debian_pkg_url =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE");
  if (cmNonempty(debian_pkg_url)) {
    controlValues["Homepage"] = *debian_pkg_url;
  }
  cmValue debian_pkg_predep =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS");
  if (cmNonempty(debian_pkg_predep)) {
    controlValues["Pre-Depends"] = *debian_pkg_predep;
  }
  cmValue debian_pkg_enhances =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ENHANCES");
  if (cmNonempty(debian_pkg_enhances)) {
    controlValues["Enhances"] = *debian_pkg_enhances;
  }
  cmValue debian_pkg_breaks =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_BREAKS");
  if (cmNonempty(debian_pkg_breaks)) {
    controlValues["Breaks"] = *debian_pkg_breaks;
  }
  cmValue debian_pkg_conflicts =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS");
  if (cmNonempty(debian_pkg_conflicts)) {
    controlValues["Conflicts"] = *debian_pkg_conflicts;
  }
  cmValue debian_pkg_provides =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PROVIDES");
  if (cmNonempty(debian_pkg_provides)) {
    controlValues["Provides"] = *debian_pkg_provides;
  }
  cmValue debian_pkg_replaces =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_REPLACES");
  if (cmNonempty(debian_pkg_replaces)) {
    controlValues["Replaces"] = *debian_pkg_replaces;
  }

  const std::string strGenWDIR(this->GetOption("GEN_WDIR"));
  const std::string shlibsfilename = strGenWDIR + "/shlibs";

  cmValue debian_pkg_shlibs =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SHLIBS");
  const bool gen_shibs = this->IsOn("CPACK_DEBIAN_PACKAGE_GENERATE_SHLIBS") &&
    cmNonempty(debian_pkg_shlibs);
  if (gen_shibs) {
    cmGeneratedFileStream out;
    out.Open(shlibsfilename, false, true);
    out << debian_pkg_shlibs;
    out << '\n';
  }

  const std::string postinst = strGenWDIR + "/postinst";
  const std::string postrm = strGenWDIR + "/postrm";
  if (this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTINST")) {
    cmGeneratedFileStream out;
    out.Open(postinst, false, true);
    out << "#!/bin/sh\n\n"
           "set -e\n\n"
           "if [ \"$1\" = \"configure\" ]; then\n"
           "\tldconfig\n"
           "fi\n";
  }
  if (this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTRM")) {
    cmGeneratedFileStream out;
    out.Open(postrm, false, true);
    out << "#!/bin/sh\n\n"
           "set -e\n\n"
           "if [ \"$1\" = \"remove\" ]; then\n"
           "\tldconfig\n"
           "fi\n";
  }

  DebGenerator gen(
    this->Logger, this->GetOption("GEN_CPACK_OUTPUT_FILE_NAME"), strGenWDIR,
    this->GetOption("CPACK_TOPLEVEL_DIRECTORY"),
    this->GetOption("CPACK_TEMPORARY_DIRECTORY"),
    this->GetOption("GEN_CPACK_DEBIAN_COMPRESSION_TYPE"),
    this->GetOption("CPACK_THREADS"),
    this->GetOption("GEN_CPACK_DEBIAN_ARCHIVE_TYPE"), controlValues, gen_shibs,
    shlibsfilename, this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTINST"), postinst,
    this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTRM"), postrm,
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA"),
    this->IsSet("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION"),
    this->packageFiles);

  return gen.generate();
}